

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O3

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::ThreadData::ThreadData
          (ThreadData *this,
          QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
          *i_parent_tester,FeedBack *i_feedback,
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *i_queue,EasyRandom *i_main_random,QueueTesterFlags i_flags)

{
  void *pvVar1;
  undefined8 *puVar2;
  allocator_type local_19;
  
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)this = i_queue;
  *(QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
    **)(this + 8) = i_parent_tester;
  *(QueueTesterFlags *)(this + 0x10) = i_flags;
  *(undefined8 *)(this + 0x18) = 0;
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters>_>
  ::vector((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters>_>
            *)(this + 0x20),
           (long)(i_parent_tester->m_put_cases).
                 super__Vector_base<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(i_parent_tester->m_put_cases).
                 super__Vector_base<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,&local_19);
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  EasyRandom::fork((EasyRandom *)(this + 0x50));
  *(undefined8 *)(this + 0x1410) = 0;
  *(undefined8 *)(this + 0x1418) = 0;
  *(undefined8 *)(this + 0x1400) = 0;
  *(undefined8 *)(this + 0x1408) = 0;
  *(undefined8 *)(this + 0x13f0) = 0;
  *(undefined8 *)(this + 0x13f8) = 0;
  *(undefined8 *)(this + 0x13e0) = 0;
  *(undefined8 *)(this + 0x13e8) = 0;
  *(FeedBack **)(this + 0x1420) = i_feedback;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  *(undefined1 *)(puVar2 + 2) = 0;
  pvVar1 = *(void **)(this + 0x48);
  *(undefined8 **)(this + 0x48) = puVar2;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

ThreadData(
              const QueueGenericTester & i_parent_tester,
              const FeedBack *           i_feedback,
              QUEUE &                    i_queue,
              EasyRandom &               i_main_random,
              QueueTesterFlags           i_flags)
                : m_queue(i_queue), m_parent_tester(i_parent_tester), m_flags(i_flags),
                  m_final_stats(i_parent_tester.m_put_cases.size()), m_random(i_main_random.fork()),
                  m_feedback(i_feedback)
            {
                m_incremental_stats = std::unique_ptr<IncrementalStats>(new IncrementalStats);
            }